

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

bool __thiscall
FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Formula *formula,uint depth)

{
  Connective CVar1;
  uint var;
  uint uVar2;
  uint *puVar3;
  size_type sVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  Formula *pFVar8;
  Term *pTVar9;
  Formula *pFVar10;
  UserErrorException *pUVar11;
  long lVar12;
  byte bVar13;
  undefined8 *puVar14;
  uint depth_00;
  Formula *pFVar15;
  byte bVar16;
  uint uVar17;
  undefined1 auVar18 [12];
  byte local_134;
  byte local_12c;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_120;
  TermList local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  depth_00 = depth + 1;
  bVar16 = 0;
LAB_002610ed:
  CVar1 = formula->_connective;
  if (0xb < (ulong)CVar1) {
switchD_00261101_caseD_9:
    pUVar11 = (UserErrorException *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_f0,formula);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                   "Cannot evaluate ",&local_f0);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                   ", not supported");
    Lib::UserErrorException::Exception(pUVar11,&local_d0);
    __cxa_throw(pUVar11,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  lVar12 = (long)&switchD_00261101::switchdataD_0071c7a8 +
           (long)(int)(&switchD_00261101::switchdataD_0071c7a8)[CVar1];
  switch(CVar1) {
  case LITERAL:
    pTVar9 = *(Term **)(formula + 1);
    bVar7 = Kernel::Term::ground(pTVar9);
    if (!bVar7) {
      pUVar11 = (UserErrorException *)__cxa_allocate_exception(0x50);
      Kernel::Formula::toString_abi_cxx11_((string *)&local_120,formula);
      std::operator+(&local_50,"Was not expecting free variables in ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                    );
      Lib::UserErrorException::Exception(pUVar11,&local_50);
      __cxa_throw(pUVar11,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    bVar5 = evaluateGroundLiteral(this,(Literal *)pTVar9);
    goto LAB_0026136e;
  case AND:
    bVar5 = 1;
    break;
  case OR:
    bVar5 = 0;
    break;
  case IMP:
    local_134 = 1;
    bVar13 = 1;
    goto LAB_002611b3;
  case IFF:
    local_134 = 1;
    goto LAB_002611b0;
  case XOR:
    local_134 = 0;
LAB_002611b0:
    bVar13 = 0;
LAB_002611b3:
    pFVar8 = (Formula *)formula[1]._label._M_dataplus._M_p;
    bVar7 = evaluate(this,*(Formula **)(formula + 1),depth_00);
    bVar5 = 1;
    if ((byte)(bVar13 ^ 1 | bVar7) == 1) {
      bVar6 = evaluate(this,pFVar8,depth_00);
      if (bVar13 == 0) {
        bVar5 = bVar6 ^ local_134 ^ bVar7;
      }
      else {
        bVar5 = bVar6 || !bVar7;
      }
    }
    goto LAB_0026136e;
  case NOT:
    goto switchD_00261101_caseD_6;
  case FORALL:
    local_12c = 1;
    goto LAB_00261221;
  case EXISTS:
    local_12c = 0;
LAB_00261221:
    puVar3 = *(uint **)(formula + 1);
    var = *puVar3;
    if (*(long *)(puVar3 + 2) == 0) {
      pFVar8 = (Formula *)formula[1]._label._M_string_length;
    }
    else {
      pFVar8 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
      uVar2 = puVar3[2];
      uVar17 = puVar3[3];
      sVar4 = formula[1]._label._M_string_length;
      Kernel::Formula::Formula(pFVar8,formula->_connective);
      pFVar8[1]._connective = uVar2;
      *(uint *)&pFVar8[1].field_0x4 = uVar17;
      pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
      pFVar8[1]._label._M_string_length = sVar4;
    }
    local_f8._content = 2;
    bVar7 = Kernel::SortHelper::tryGetVariableSort(var,formula,&local_f8);
    if (!bVar7) {
      auVar18 = __cxa_allocate_exception(0x50);
      Lib::Int::toString_abi_cxx11_(&local_90,(Int *)(ulong)var,auVar18._8_4_);
      std::operator+(&local_f0,"Failed to get sort of ",&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,&local_f0," in ");
      Kernel::Formula::toString_abi_cxx11_(&local_b0,formula);
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,&local_b0);
      Lib::UserErrorException::Exception(auVar18._0_8_,&local_70);
      __cxa_throw(auVar18._0_8_,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    uVar2 = *(uint *)(local_f8._content + 8);
    uVar17 = 1;
    pFVar15 = pFVar8;
    goto LAB_002612bd;
  case BOOL_TERM:
    goto switchD_00261101_caseD_9;
  case FALSE:
    goto LAB_00261211;
  case TRUE:
    goto LAB_002611fd;
  }
  puVar14 = *(undefined8 **)(formula + 1);
  goto LAB_00261164;
  while( true ) {
    local_120._timestamp = 1;
    local_120._20_8_ = 0;
    local_120._28_8_ = 0;
    local_120._size = 0;
    local_120._deleted = 0;
    local_120._capacityIndex = 0;
    local_120._capacity = 0;
    local_120._afterLast._4_4_ = 0;
    pTVar9 = getDomainConstant(this,uVar17,uVar2);
    Kernel::Substitution::bind((Substitution *)&local_120,var,(sockaddr *)pTVar9,(socklen_t)lVar12);
    pFVar10 = Kernel::SubstHelper::apply<Kernel::Substitution>(pFVar8,(Substitution *)&local_120);
    pFVar10 = Shell::SimplifyFalseTrue::simplify(pFVar10);
    pFVar10 = Shell::Flattening::flatten(pFVar10);
    bVar7 = evaluate(this,pFVar10,depth_00);
    if (bVar7 || local_12c != 1) {
      bVar13 = !bVar7 | local_12c;
      pFVar15 = (Formula *)(ulong)(byte)(bVar13 ^ 1 | (byte)pFVar15);
    }
    else {
      bVar13 = 0;
      pFVar15 = (Formula *)0x0;
    }
    bVar5 = (byte)pFVar15;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_120);
    uVar17 = uVar17 + 1;
    if (bVar13 == 0) break;
LAB_002612bd:
    bVar5 = local_12c;
    if ((this->_sizes)._array[uVar2] < uVar17) break;
  }
  goto LAB_0026136e;
switchD_00261101_caseD_6:
  formula = *(Formula **)(formula + 1);
  bVar16 = bVar16 ^ 1;
  depth_00 = depth_00 + 1;
  goto LAB_002610ed;
LAB_00261211:
  bVar5 = 0;
  goto LAB_0026136e;
  while( true ) {
    pFVar8 = (Formula *)*puVar14;
    puVar14 = (undefined8 *)puVar14[1];
    bVar7 = evaluate(this,pFVar8,depth_00);
    if ((byte)(bVar7 | bVar5 ^ 1) != 1) goto LAB_00261211;
    if (bVar7 && bVar5 == 0) break;
LAB_00261164:
    if (puVar14 == (undefined8 *)0x0) goto LAB_0026136e;
  }
LAB_002611fd:
  bVar5 = 1;
LAB_0026136e:
  return (bool)((bVar16 ^ bVar5) & 1);
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Formula* formula,unsigned depth)
{
#if DEBUG_MODEL
  for(unsigned i=0;i<depth;i++){ cout << "."; }
  cout << "Evaluating..." << formula->toString() << endl;
#endif

  bool isAnd = false;
  bool isImp = false;
  bool isXor = false;
  bool isForall = false;
  switch(formula->connective()){
    // If it's a literal evaluate that
    case LITERAL:
    {
      Literal* lit = formula->literal();
      if(!lit->ground()){
        USER_ERROR("Was not expecting free variables in "+formula->toString());
      }
      return evaluateGroundLiteral(lit);
    }

    // Expand the standard ones
    case FALSE:
      return false;
    case TRUE:
      return true;
    case NOT:
      return !evaluate(formula->uarg(),depth+1);
    case AND:
      isAnd=true;
    case OR:
      {
        FormulaList* args = formula->args();
        FormulaList::Iterator fit(args);
        while(fit.hasNext()){
          Formula* arg = fit.next();
          bool res = evaluate(arg,depth+1);
          if(isAnd && !res) return false;
          if(!isAnd && res) return true;
        }
        return isAnd;
      }

    case IMP:
     isImp=true;
    case XOR:
     isXor = !isImp;
    case IFF:
    {
      Formula* left = formula->left();
      Formula* right = formula->right();
      bool left_res = evaluate(left,depth+1);
      if(isImp && !left_res) return true;
      bool right_res = evaluate(right,depth+1);

#if DEBUG_MODEL
      cout << "left_res is " << left_res << ", right_res is " << right_res << endl;
#endif

      if(isImp) return !left_res || right_res;
      if(isXor) return left_res != right_res;
      return left_res == right_res; // IFF
    }

    // Expand quantifications
    case FORALL:
     isForall = true;
    case EXISTS:
    {
     VList* vs = formula->vars();
     int var = vs->head();

     //cout << "Quant " << isForall << " with " << var << endl;

     Formula* next = 0;
     if(vs->tail()) next = new QuantifiedFormula(formula->connective(),vs->tail(),0,formula->qarg());
     else next = formula->qarg();

     TermList srt;
     if(!SortHelper::tryGetVariableSort(var,formula,srt)){
       USER_ERROR("Failed to get sort of "+Lib::Int::toString(var)+" in "+formula->toString());
     }

     unsigned srtU = srt.term()->functor();
     for(unsigned c=1;c<=_sizes[srtU];c++){
       Substitution s;
       s.bind(var,getDomainConstant(c,srtU));
       Formula* next_sub = SubstHelper::apply(next,s);
       next_sub = SimplifyFalseTrue::simplify(next_sub);
       next_sub = Flattening::flatten(next_sub);

       bool res = evaluate(next_sub,depth+1);

       //TODO try and limit memory issues!
       //     ideally delete the bits introduced by the application of SubstHelper::apply
       //if(next_sub!=next) next_sub->destroy();

       if(isForall && !res) return false;
       if(!isForall && res) return true;
     }

     return isForall;
    }
    default:
      USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
  }

  NOT_IMPLEMENTED;
  return false;
}